

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eeep_parse.c
# Opt level: O1

void ParseBoardInformation(EeePModuleInfo_t *info)

{
  size_t sVar1;
  long lVar2;
  char *pcVar3;
  uint8_t uVar4;
  uint8_t *__s;
  uint8_t *puVar5;
  
  __s = info->Handles[0].b + (ulong)info->ContainedHndls * 2;
  uVar4 = info->Manufacturer;
  puVar5 = __s;
  if (uVar4 == '\0') {
    puVar5 = (uint8_t *)0x0;
  }
  else {
    while (uVar4 = uVar4 + 0xff, uVar4 != '\0') {
      sVar1 = strlen((char *)puVar5);
      puVar5 = puVar5 + sVar1 + 1;
    }
  }
  if (puVar5 != (uint8_t *)0x0) {
    printf("      Manufacturer: %s\n",puVar5);
  }
  uVar4 = info->Product;
  puVar5 = __s;
  if (uVar4 == '\0') {
    puVar5 = (uint8_t *)0x0;
  }
  else {
    while (uVar4 = uVar4 + 0xff, uVar4 != '\0') {
      sVar1 = strlen((char *)puVar5);
      puVar5 = puVar5 + sVar1 + 1;
    }
  }
  if (puVar5 != (uint8_t *)0x0) {
    printf("      Product: %s\n",puVar5);
  }
  uVar4 = info->Version;
  puVar5 = __s;
  if (uVar4 == '\0') {
    puVar5 = (uint8_t *)0x0;
  }
  else {
    while (uVar4 = uVar4 + 0xff, uVar4 != '\0') {
      sVar1 = strlen((char *)puVar5);
      puVar5 = puVar5 + sVar1 + 1;
    }
  }
  if (puVar5 != (uint8_t *)0x0) {
    printf("      Version: %s\n",puVar5);
  }
  uVar4 = info->SerialNumber;
  puVar5 = __s;
  if (uVar4 == '\0') {
    puVar5 = (uint8_t *)0x0;
  }
  else {
    while (uVar4 = uVar4 + 0xff, uVar4 != '\0') {
      sVar1 = strlen((char *)puVar5);
      puVar5 = puVar5 + sVar1 + 1;
    }
  }
  if (puVar5 != (uint8_t *)0x0) {
    printf("      Serial Number: %s\n",puVar5);
  }
  uVar4 = info->AssetTag;
  puVar5 = __s;
  if (uVar4 == '\0') {
    puVar5 = (uint8_t *)0x0;
  }
  else {
    while (uVar4 = uVar4 + 0xff, uVar4 != '\0') {
      sVar1 = strlen((char *)puVar5);
      puVar5 = puVar5 + sVar1 + 1;
    }
  }
  if (puVar5 != (uint8_t *)0x0) {
    printf("      Asset Tag: %s\n",puVar5);
  }
  if (info->FeatureFlag != '\0') {
    printf("      Features: ");
    if ((info->FeatureFlag & 1) != 0) {
      printf("Motherboard ");
    }
    if ((info->FeatureFlag & 2) != 0) {
      printf("ReqDaughterBoard ");
    }
    if ((info->FeatureFlag & 4) != 0) {
      printf("Removable ");
    }
    if ((info->FeatureFlag & 8) != 0) {
      printf("Replaceable ");
    }
    if ((info->FeatureFlag & 0x10) != 0) {
      printf("HotSwapCapable ");
    }
    putchar(10);
  }
  uVar4 = info->Location;
  if (uVar4 == '\0') {
    __s = (uint8_t *)0x0;
  }
  else {
    while (uVar4 = uVar4 + 0xff, uVar4 != '\0') {
      sVar1 = strlen((char *)__s);
      __s = __s + sVar1 + 1;
    }
  }
  if (__s != (uint8_t *)0x0) {
    printf("      Location: %s\n",__s);
  }
  lVar2 = 8;
  pcVar3 = "";
  do {
    if (*(byte *)((long)&SmbiosBlockTexts[7].text + lVar2) == info->BoardType) {
      pcVar3 = *(char **)(&BoardTypeTexts[0].code + lVar2);
      break;
    }
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0xd8);
  printf("      Board Type: %d (%s)\n",(ulong)info->BoardType,pcVar3);
  return;
}

Assistant:

void ParseBoardInformation(EeePModuleInfo_t *info)
{
    void *strstart = info->Handles + info->ContainedHndls;
    const char *str;
    if (str = GetSmbiosString(info->Manufacturer, strstart)) {
        printf("      Manufacturer: %s\n", str);
    }
    if (str = GetSmbiosString(info->Product, strstart)) {
        printf("      Product: %s\n", str);
    }
    if (str = GetSmbiosString(info->Version, strstart)) {
        printf("      Version: %s\n", str);
    }
    if (str = GetSmbiosString(info->SerialNumber, strstart)) {
        printf("      Serial Number: %s\n", str);
    }
    if (str = GetSmbiosString(info->AssetTag, strstart)) {
        printf("      Asset Tag: %s\n", str);
    }
    if (info->FeatureFlag) {
        printf("      Features: ");
        if (info->FeatureFlag & SMBIOS_IS_Motherboard) {
            printf("Motherboard ");
        }
        if (info->FeatureFlag & SMBIOS_REQ_DAUGHTER) {
            printf("ReqDaughterBoard ");
        }
        if (info->FeatureFlag & SMBIOS_REMOVABLE) {
            printf("Removable ");
        }
        if (info->FeatureFlag & SMBIOS_REPLACEABLE) {
            printf("Replaceable ");
        }
        if (info->FeatureFlag & SMBIOS_HOT_SWAP_CAP) {
            printf("HotSwapCapable ");
        }
        printf("\n");
    }
    if (str = GetSmbiosString(info->Location, strstart)) {
        printf("      Location: %s\n", str);
    }
    printf("      Board Type: %d (%s)\n", 
        info->BoardType, FindBoardTypeText(info->BoardType));
}